

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterAdvanced(Fts5Index *p,Fts5Iter *pIter,int iChanged,int iMinset)

{
  int iVar1;
  bool bVar2;
  Fts5SegIter *pSeg;
  int iEq;
  int i;
  int iMinset_local;
  int iChanged_local;
  Fts5Iter *pIter_local;
  Fts5Index *p_local;
  
  pSeg._4_4_ = pIter->nSeg + iChanged;
  while( true ) {
    pSeg._4_4_ = pSeg._4_4_ / 2;
    bVar2 = false;
    if (iMinset <= pSeg._4_4_) {
      bVar2 = p->rc == 0;
    }
    if (!bVar2) break;
    iVar1 = fts5MultiIterDoCompare(pIter,pSeg._4_4_);
    if (iVar1 != 0) {
      (*pIter->aSeg[iVar1].xNext)(p,pIter->aSeg + iVar1,(int *)0x0);
      pSeg._4_4_ = pIter->nSeg + iVar1;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterAdvanced(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Iter *pIter,                /* Iterator to update aFirst[] array for */
  int iChanged,                   /* Index of sub-iterator just advanced */
  int iMinset                     /* Minimum entry in aFirst[] to set */
){
  int i;
  for(i=(pIter->nSeg+iChanged)/2; i>=iMinset && p->rc==SQLITE_OK; i=i/2){
    int iEq;
    if( (iEq = fts5MultiIterDoCompare(pIter, i)) ){
      Fts5SegIter *pSeg = &pIter->aSeg[iEq];
      assert( p->rc==SQLITE_OK );
      pSeg->xNext(p, pSeg, 0);
      i = pIter->nSeg + iEq;
    }
  }
}